

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisNodeHandlerModrmReg
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanStatus ZVar1;
  ZyanU8 local_29;
  ZyanStatus status_047620348;
  ZyanU8 modrm_byte;
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  _status_047620348 = index;
  index_local = (ZyanU16 *)instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf26,
                  "ZyanStatus ZydisNodeHandlerModrmReg(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (index == (ZyanU16 *)0x0) {
      __assert_fail("index",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xf28,
                    "ZyanStatus ZydisNodeHandlerModrmReg(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                   );
    }
    if ((instruction->raw).modrm.offset == '\0') {
      (instruction->raw).modrm.offset = instruction->length;
      ZVar1 = ZydisInputNext(state,instruction,&local_29);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
      ZydisDecodeModRM((ZydisDecodedInstruction *)index_local,local_29);
    }
    *_status_047620348 = (ushort)(byte)index_local[0x80];
    return 0x100000;
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xf27,
                "ZyanStatus ZydisNodeHandlerModrmReg(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
               );
}

Assistant:

static ZyanStatus ZydisNodeHandlerModrmReg(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    if (!instruction->raw.modrm.offset)
    {
        instruction->raw.modrm.offset = instruction->length;
        ZyanU8 modrm_byte;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &modrm_byte));
        ZydisDecodeModRM(instruction, modrm_byte);
    }
    *index = instruction->raw.modrm.reg;
    return ZYAN_STATUS_SUCCESS;
}